

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_inverse_pairs_are_not_valid_Test::TestBody
          (CurrenciesTest_test_inverse_pairs_are_not_valid_Test *this)

{
  byte bVar1;
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GBPEUR",(allocator<char> *)&local_50);
  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Currencies::IsValidCurrencyPair(\"GBPEUR\")","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0x90,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"AUDEUR",(allocator<char> *)&local_50);
    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
    gtest_ar_.success_ = (bool)(bVar1 ^ 1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&local_40);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&gtest_ar_,
                 (AssertionResult *)"Currencies::IsValidCurrencyPair(\"AUDEUR\")","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x91,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"NZDEUR",(allocator<char> *)&local_50);
      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
      gtest_ar_.success_ = (bool)(bVar1 ^ 1);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__cxx11::string::~string((string *)&local_40);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)&gtest_ar_,
                   (AssertionResult *)"Currencies::IsValidCurrencyPair(\"NZDEUR\")","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x92,local_40._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"USDEUR",(allocator<char> *)&local_50);
        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
        gtest_ar_.success_ = (bool)(bVar1 ^ 1);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::__cxx11::string::~string((string *)&local_40);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,(internal *)&gtest_ar_,
                     (AssertionResult *)"Currencies::IsValidCurrencyPair(\"USDEUR\")","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                     ,0x93,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"CADEUR",(allocator<char> *)&local_50);
          bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
          gtest_ar_.success_ = (bool)(bVar1 ^ 1);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          std::__cxx11::string::~string((string *)&local_40);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_40,(internal *)&gtest_ar_,
                       (AssertionResult *)"Currencies::IsValidCurrencyPair(\"CADEUR\")","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                       ,0x94,local_40._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"CHFEUR",(allocator<char> *)&local_50);
            bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
            gtest_ar_.success_ = (bool)(bVar1 ^ 1);
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            std::__cxx11::string::~string((string *)&local_40);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_50);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_40,(internal *)&gtest_ar_,
                         (AssertionResult *)"Currencies::IsValidCurrencyPair(\"CHFEUR\")","true",
                         "false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                         ,0x95,local_40._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar_.message_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40,"NOKEUR",(allocator<char> *)&local_50);
              bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair((string *)&local_40);
              gtest_ar_.success_ = (bool)(bVar1 ^ 1);
              gtest_ar_.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::__cxx11::string::~string((string *)&local_40);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&local_50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_40,(internal *)&gtest_ar_,
                           (AssertionResult *)"Currencies::IsValidCurrencyPair(\"NOKEUR\")","true",
                           "false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_48,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                           ,0x96,local_40._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar_.message_);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_40,"DKKEUR",(allocator<char> *)&local_50);
                bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                  ((string *)&local_40);
                gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                std::__cxx11::string::~string((string *)&local_40);
                if (gtest_ar_.success_ == false) {
                  testing::Message::Message((Message *)&local_50);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_40,(internal *)&gtest_ar_,
                             (AssertionResult *)"Currencies::IsValidCurrencyPair(\"DKKEUR\")","true"
                             ,"false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_48,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                             ,0x97,local_40._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar_.message_);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_40,"SEKEUR",(allocator<char> *)&local_50);
                  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                    ((string *)&local_40);
                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                  gtest_ar_.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  std::__cxx11::string::~string((string *)&local_40);
                  if (gtest_ar_.success_ == false) {
                    testing::Message::Message((Message *)&local_50);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_40,(internal *)&gtest_ar_,
                               (AssertionResult *)"Currencies::IsValidCurrencyPair(\"SEKEUR\")",
                               "true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_48,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                               ,0x98,local_40._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar_.message_);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_40,"JPYEUR",(allocator<char> *)&local_50);
                    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                      ((string *)&local_40);
                    gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                    gtest_ar_.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    std::__cxx11::string::~string((string *)&local_40);
                    if (gtest_ar_.success_ == false) {
                      testing::Message::Message((Message *)&local_50);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_40,(internal *)&gtest_ar_,
                                 (AssertionResult *)"Currencies::IsValidCurrencyPair(\"JPYEUR\")",
                                 "true","false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_48,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                 ,0x99,local_40._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar_.message_);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_40,"AUDGBP",(allocator<char> *)&local_50);
                      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                        ((string *)&local_40);
                      gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                      gtest_ar_.message_.ptr_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      std::__cxx11::string::~string((string *)&local_40);
                      if (gtest_ar_.success_ == false) {
                        testing::Message::Message((Message *)&local_50);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_40,(internal *)&gtest_ar_,
                                   (AssertionResult *)"Currencies::IsValidCurrencyPair(\"AUDGBP\")",
                                   "true","false",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_48,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                   ,0x9a,local_40._M_dataplus._M_p);
                        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar_.message_);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_40,"NZDGBP",(allocator<char> *)&local_50);
                        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                          ((string *)&local_40);
                        gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                        gtest_ar_.message_.ptr_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                        std::__cxx11::string::~string((string *)&local_40);
                        if (gtest_ar_.success_ == false) {
                          testing::Message::Message((Message *)&local_50);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_40,(internal *)&gtest_ar_,
                                     (AssertionResult *)
                                     "Currencies::IsValidCurrencyPair(\"NZDGBP\")","true","false",
                                     in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_48,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                     ,0x9b,local_40._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50)
                          ;
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar_.message_);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_40,"USDGBP",(allocator<char> *)&local_50);
                          bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                            ((string *)&local_40);
                          gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                          gtest_ar_.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          std::__cxx11::string::~string((string *)&local_40);
                          if (gtest_ar_.success_ == false) {
                            testing::Message::Message((Message *)&local_50);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      (&local_40,(internal *)&gtest_ar_,
                                       (AssertionResult *)
                                       "Currencies::IsValidCurrencyPair(\"USDGBP\")","true","false",
                                       in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_48,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                       ,0x9c,local_40._M_dataplus._M_p);
                            testing::internal::AssertHelper::operator=
                                      (&local_48,(Message *)&local_50);
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar_.message_);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_40,"CADGBP",(allocator<char> *)&local_50);
                            bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                              ((string *)&local_40);
                            gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                            gtest_ar_.message_.ptr_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                            std::__cxx11::string::~string((string *)&local_40);
                            if (gtest_ar_.success_ == false) {
                              testing::Message::Message((Message *)&local_50);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        (&local_40,(internal *)&gtest_ar_,
                                         (AssertionResult *)
                                         "Currencies::IsValidCurrencyPair(\"CADGBP\")","true",
                                         "false",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_48,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                         ,0x9d,local_40._M_dataplus._M_p);
                              testing::internal::AssertHelper::operator=
                                        (&local_48,(Message *)&local_50);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_.message_);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_40,"CHFGBP",(allocator<char> *)&local_50);
                              bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                ((string *)&local_40);
                              gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                              gtest_ar_.message_.ptr_ =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                              std::__cxx11::string::~string((string *)&local_40);
                              if (gtest_ar_.success_ == false) {
                                testing::Message::Message((Message *)&local_50);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_40,(internal *)&gtest_ar_,
                                           (AssertionResult *)
                                           "Currencies::IsValidCurrencyPair(\"CHFGBP\")","true",
                                           "false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_48,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                           ,0x9e,local_40._M_dataplus._M_p);
                                testing::internal::AssertHelper::operator=
                                          (&local_48,(Message *)&local_50);
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr(&gtest_ar_.message_);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_40,"NOKGBP",(allocator<char> *)&local_50
                                          );
                                bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                  ((string *)&local_40);
                                gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                gtest_ar_.message_.ptr_ =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x0;
                                std::__cxx11::string::~string((string *)&local_40);
                                if (gtest_ar_.success_ == false) {
                                  testing::Message::Message((Message *)&local_50);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            (&local_40,(internal *)&gtest_ar_,
                                             (AssertionResult *)
                                             "Currencies::IsValidCurrencyPair(\"NOKGBP\")","true",
                                             "false",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_48,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                             ,0x9f,local_40._M_dataplus._M_p);
                                  testing::internal::AssertHelper::operator=
                                            (&local_48,(Message *)&local_50);
                                }
                                else {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr(&gtest_ar_.message_);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_40,"DKKGBP",
                                             (allocator<char> *)&local_50);
                                  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                    ((string *)&local_40);
                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                  gtest_ar_.message_.ptr_ =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0;
                                  std::__cxx11::string::~string((string *)&local_40);
                                  if (gtest_ar_.success_ == false) {
                                    testing::Message::Message((Message *)&local_50);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              (&local_40,(internal *)&gtest_ar_,
                                               (AssertionResult *)
                                               "Currencies::IsValidCurrencyPair(\"DKKGBP\")","true",
                                               "false",in_R9);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_48,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                               ,0xa0,local_40._M_dataplus._M_p);
                                    testing::internal::AssertHelper::operator=
                                              (&local_48,(Message *)&local_50);
                                  }
                                  else {
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr(&gtest_ar_.message_);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_40,"SEKGBP",
                                               (allocator<char> *)&local_50);
                                    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                      ((string *)&local_40);
                                    gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                    gtest_ar_.message_.ptr_ =
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                                    std::__cxx11::string::~string((string *)&local_40);
                                    if (gtest_ar_.success_ == false) {
                                      testing::Message::Message((Message *)&local_50);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_40,(internal *)&gtest_ar_,
                                                 (AssertionResult *)
                                                 "Currencies::IsValidCurrencyPair(\"SEKGBP\")",
                                                 "true","false",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_48,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                 ,0xa1,local_40._M_dataplus._M_p);
                                      testing::internal::AssertHelper::operator=
                                                (&local_48,(Message *)&local_50);
                                    }
                                    else {
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr(&gtest_ar_.message_);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_40,"JPYGBP",
                                                 (allocator<char> *)&local_50);
                                      bVar1 = bidfx_public_api::price::Currencies::
                                              IsValidCurrencyPair((string *)&local_40);
                                      gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                      gtest_ar_.message_.ptr_ =
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)0x0;
                                      std::__cxx11::string::~string((string *)&local_40);
                                      if (gtest_ar_.success_ == false) {
                                        testing::Message::Message((Message *)&local_50);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  (&local_40,(internal *)&gtest_ar_,
                                                   (AssertionResult *)
                                                   "Currencies::IsValidCurrencyPair(\"JPYGBP\")",
                                                   "true","false",in_R9);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_48,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa2,local_40._M_dataplus._M_p);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_48,(Message *)&local_50);
                                      }
                                      else {
                                        testing::internal::
                                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~scoped_ptr(&gtest_ar_.message_);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_40,"NZDAUD",
                                                   (allocator<char> *)&local_50);
                                        bVar1 = bidfx_public_api::price::Currencies::
                                                IsValidCurrencyPair((string *)&local_40);
                                        gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                        gtest_ar_.message_.ptr_ =
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)0x0;
                                        std::__cxx11::string::~string((string *)&local_40);
                                        if (gtest_ar_.success_ == false) {
                                          testing::Message::Message((Message *)&local_50);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    (&local_40,(internal *)&gtest_ar_,
                                                     (AssertionResult *)
                                                     "Currencies::IsValidCurrencyPair(\"NZDAUD\")",
                                                     "true","false",in_R9);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_48,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa3,local_40._M_dataplus._M_p);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_48,(Message *)&local_50);
                                        }
                                        else {
                                          testing::internal::
                                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~scoped_ptr(&gtest_ar_.message_);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_40,"USDAUD",
                                                     (allocator<char> *)&local_50);
                                          bVar1 = bidfx_public_api::price::Currencies::
                                                  IsValidCurrencyPair((string *)&local_40);
                                          gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                          gtest_ar_.message_.ptr_ =
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)0x0;
                                          std::__cxx11::string::~string((string *)&local_40);
                                          if (gtest_ar_.success_ == false) {
                                            testing::Message::Message((Message *)&local_50);
                                            testing::internal::
                                            GetBoolAssertionFailureMessage_abi_cxx11_
                                                      (&local_40,(internal *)&gtest_ar_,
                                                       (AssertionResult *)
                                                       "Currencies::IsValidCurrencyPair(\"USDAUD\")"
                                                       ,"true","false",in_R9);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_48,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa4,local_40._M_dataplus._M_p);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_48,(Message *)&local_50);
                                          }
                                          else {
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr(&gtest_ar_.message_);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_40,"CADAUD",
                                                       (allocator<char> *)&local_50);
                                            bVar1 = bidfx_public_api::price::Currencies::
                                                    IsValidCurrencyPair((string *)&local_40);
                                            gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                            gtest_ar_.message_.ptr_ =
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                            std::__cxx11::string::~string((string *)&local_40);
                                            if (gtest_ar_.success_ == false) {
                                              testing::Message::Message((Message *)&local_50);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        (&local_40,(internal *)&gtest_ar_,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CADAUD\")",
                                                  "true","false",in_R9);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_48,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa5,local_40._M_dataplus._M_p);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_48,(Message *)&local_50);
                                            }
                                            else {
                                              testing::internal::
                                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~scoped_ptr(&gtest_ar_.message_);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_40,"CHFAUD",
                                                         (allocator<char> *)&local_50);
                                              bVar1 = bidfx_public_api::price::Currencies::
                                                      IsValidCurrencyPair((string *)&local_40);
                                              gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                              gtest_ar_.message_.ptr_ =
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                              std::__cxx11::string::~string((string *)&local_40);
                                              if (gtest_ar_.success_ == false) {
                                                testing::Message::Message((Message *)&local_50);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          (&local_40,(internal *)&gtest_ar_,
                                                           (AssertionResult *)
                                                                                                                      
                                                  "Currencies::IsValidCurrencyPair(\"CHFAUD\")",
                                                  "true","false",in_R9);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_48,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa6,local_40._M_dataplus._M_p);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_48,(Message *)&local_50);
                                              }
                                              else {
                                                testing::internal::
                                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::~scoped_ptr(&gtest_ar_.message_);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_40,"NOKAUD",
                                                           (allocator<char> *)&local_50);
                                                bVar1 = bidfx_public_api::price::Currencies::
                                                        IsValidCurrencyPair((string *)&local_40);
                                                gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                gtest_ar_.message_.ptr_ =
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                std::__cxx11::string::~string((string *)&local_40);
                                                if (gtest_ar_.success_ == false) {
                                                  testing::Message::Message((Message *)&local_50);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            (&local_40,(internal *)&gtest_ar_,
                                                             (AssertionResult *)
                                                                                                                          
                                                  "Currencies::IsValidCurrencyPair(\"NOKAUD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa7,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                }
                                                else {
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKAUD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKAUD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa8,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKAUD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKAUD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa9,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYAUD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYAUD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xaa,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"USDNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"USDNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xab,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"CADNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"CADNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xac,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"CHFNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"CHFNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xad,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"NOKNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"NOKNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xae,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xaf,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb0,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYNZD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYNZD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb1,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"CADUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"CADUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb2,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"CHFUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"CHFUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb3,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"NOKUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"NOKUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb4,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb5,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb6,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYUSD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYUSD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb7,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"CHFCAD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"CHFCAD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb8,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"NOKCAD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"NOKCAD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb9,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKCAD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKCAD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xba,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKCAD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKCAD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbb,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYCAD",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYCAD\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbc,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"NOKCHF",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"NOKCHF\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbd,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKCHF",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKCHF\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbe,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKCHF",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKCHF\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbf,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYCHF",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYCHF\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc0,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"DKKNOK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKNOK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc1,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKNOK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKNOK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc2,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYNOK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYNOK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc3,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"SEKDKK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"SEKDKK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc4,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYDKK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&local_50);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              (&local_40,(internal *)&gtest_ar_,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"JPYDKK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc5,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&gtest_ar_.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_40,"JPYSEK",
                                                             (allocator<char> *)&local_50);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair((string *)&local_40);
                                                  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
                                                  gtest_ar_.message_.ptr_ =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  std::__cxx11::string::~string((string *)&local_40)
                                                  ;
                                                  if (bVar1 == 0) goto LAB_0017cec0;
                                                  testing::Message::Message((Message *)&local_50);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            (&local_40,(internal *)&gtest_ar_,
                                                             (AssertionResult *)
                                                                                                                          
                                                  "Currencies::IsValidCurrencyPair(\"JPYSEK\")",
                                                  "true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc6,local_40._M_dataplus._M_p);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&local_50);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  std::__cxx11::string::~string((string *)&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
LAB_0017cec0:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(CurrenciesTest, test_inverse_pairs_are_not_valid)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("GBPEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("AUDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("AUDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKDKK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYDKK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYSEK"));
}